

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParsePageSize(WastParser *this,uint32_t *out_page_size)

{
  bool bVar1;
  Result result_00;
  Literal *pLVar2;
  ParseIntType in_R8D;
  string_view v;
  Token local_138;
  Location local_f8;
  wabt *local_d8;
  char *local_d0;
  Enum local_c4;
  wabt *local_c0;
  string_view sv;
  undefined1 local_90 [8];
  Token token;
  Location local_48;
  Result local_24;
  uint32_t *puStack_20;
  Result result;
  uint32_t *out_page_size_local;
  WastParser *this_local;
  
  puStack_20 = out_page_size;
  Result::Result(&local_24,Ok);
  bVar1 = PeekMatchLpar(this,PageSize);
  if (bVar1) {
    bVar1 = Features::custom_page_sizes_enabled(&this->options_->features);
    if (!bVar1) {
      GetLocation(&local_48,this);
      Error(this,0x2bc82c);
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    token.field_2._20_4_ = Expect(this,Lpar);
    bVar1 = Failed((Result)token.field_2._20_4_);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    token.field_2._16_4_ = Expect(this,PageSize);
    bVar1 = Failed((Result)token.field_2._16_4_);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    GetToken((Token *)local_90,this);
    bVar1 = Token::HasLiteral((Token *)local_90);
    if (!bVar1) {
      GetLocation((Location *)&sv._M_str,this);
      Error(this,0x2bc857);
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    pLVar2 = Token::literal((Token *)local_90);
    local_d8 = (wabt *)(pLVar2->text)._M_len;
    local_d0 = (pLVar2->text)._M_str;
    v._M_str = (char *)puStack_20;
    v._M_len = (size_t)local_d0;
    local_c0 = local_d8;
    sv._M_len = (size_t)local_d0;
    local_c4 = (Enum)ParseInt32(local_d8,v,(uint32_t *)0x0,in_R8D);
    Result::operator|=(&local_24,(Result)local_c4);
    if ((*puStack_20 == 0) || ((*puStack_20 & *puStack_20 - 1) != 0)) {
      GetLocation(&local_f8,this);
      Error(this,0x2bc857);
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    Consume(&local_138,this);
    result_00 = Expect(this,Rpar);
    bVar1 = Failed(result_00);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
  }
  return (Result)local_24.enum_;
}

Assistant:

Result WastParser::ParsePageSize(uint32_t* out_page_size) {
  WABT_TRACE(ParsePageSize);

  Result result = Result::Ok;

  if (PeekMatchLpar(TokenType::PageSize)) {
    if (!options_->features.custom_page_sizes_enabled()) {
      Error(GetLocation(), "Specifying memory page size is not allowed");
      return Result::Error;
    }
    EXPECT(Lpar);
    EXPECT(PageSize);
    auto token = GetToken();
    if (!token.HasLiteral()) {
      Error(GetLocation(), "malformed custom page size");
      return Result::Error;
    }
    auto sv = token.literal().text;
    result |= ParseInt32(sv, out_page_size, ParseIntType::UnsignedOnly);
    if (*out_page_size > UINT32_MAX || *out_page_size <= 0 ||
        (*out_page_size & (*out_page_size - 1))) {
      Error(GetLocation(), "malformed custom page size");
      return Result::Error;
    }
    Consume();
    EXPECT(Rpar);
  }

  return result;
}